

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_write_vec2_float(void *a,float *uv,uint32_t nr_of_vec2_positions,trico_stream_type st)

{
  ssize_t sVar1;
  int iVar2;
  uint8_t header;
  uint32_t nr_of_compressed_v_bytes;
  uint32_t nr_of_compressed_u_bytes;
  uint32_t nr_of_vec2_positions_local;
  uint8_t *compressed_v;
  uint8_t *compressed_u;
  float *v;
  float *u;
  
  header = (uint8_t)st;
  nr_of_vec2_positions_local = nr_of_vec2_positions;
  sVar1 = write((int)&header,(void *)0x1,1);
  iVar2 = 0;
  if ((int)sVar1 != 0) {
    sVar1 = write((int)&nr_of_vec2_positions_local,(void *)0x4,1);
    if ((int)sVar1 != 0) {
      u = (float *)malloc((ulong)nr_of_vec2_positions << 2);
      v = (float *)malloc((ulong)nr_of_vec2_positions << 2);
      trico_transpose_uv_aos_to_soa(&u,&v,uv,nr_of_vec2_positions);
      trico_compress(&nr_of_compressed_u_bytes,&compressed_u,u,nr_of_vec2_positions,4,10);
      free(u);
      sVar1 = write((int)&nr_of_compressed_u_bytes,(void *)0x4,1);
      iVar2 = 0;
      if ((int)sVar1 != 0) {
        sVar1 = write((int)compressed_u,(void *)0x1,(ulong)nr_of_compressed_u_bytes);
        if ((int)sVar1 != 0) {
          free(compressed_u);
          trico_compress(&nr_of_compressed_v_bytes,&compressed_v,v,nr_of_vec2_positions,4,10);
          free(v);
          sVar1 = write((int)&nr_of_compressed_v_bytes,(void *)0x4,1);
          iVar2 = 0;
          if ((int)sVar1 != 0) {
            sVar1 = write((int)compressed_v,(void *)0x1,(ulong)nr_of_compressed_v_bytes);
            if ((int)sVar1 != 0) {
              free(compressed_v);
              iVar2 = 1;
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int trico_write_vec2_float(void* a, const float* uv, uint32_t nr_of_vec2_positions, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)st;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_vec2_positions, sizeof(uint32_t), 1, arch))
    return 0;

  float* u = (float*)trico_malloc(sizeof(float)*nr_of_vec2_positions);
  float* v = (float*)trico_malloc(sizeof(float)*nr_of_vec2_positions);
  trico_transpose_uv_aos_to_soa(&u, &v, uv, nr_of_vec2_positions);

  uint32_t nr_of_compressed_u_bytes;
  uint8_t* compressed_u;
  trico_compress(&nr_of_compressed_u_bytes, &compressed_u, u, nr_of_vec2_positions, 4, 10);

  trico_free(u);
  if (!write(&nr_of_compressed_u_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_u, 1, nr_of_compressed_u_bytes, arch))
    return 0;
  trico_free(compressed_u);

  uint32_t nr_of_compressed_v_bytes;
  uint8_t* compressed_v;
  trico_compress(&nr_of_compressed_v_bytes, &compressed_v, v, nr_of_vec2_positions, 4, 10);

  trico_free(v);
  if (!write(&nr_of_compressed_v_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_v, 1, nr_of_compressed_v_bytes, arch))
    return 0;
  trico_free(compressed_v);

  return 1;
  }